

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O1

void __thiscall FIX::Exception::Exception(Exception *this,string *t,string *d)

{
  size_type sVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  sVar1 = d->_M_string_length;
  if (sVar1 == 0) {
    local_70 = &local_60;
    pcVar2 = (t->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + t->_M_string_length);
  }
  else {
    local_50[0] = local_40;
    pcVar2 = (t->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + t->_M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)(d->_M_dataplus)._M_p);
    local_70 = &local_60;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  std::logic_error::logic_error(&this->super_logic_error,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((sVar1 != 0) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  *(undefined ***)this = &PTR__Exception_0017a838;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar2 = (t->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar2,pcVar2 + t->_M_string_length);
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  pcVar2 = (d->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->detail,pcVar2,pcVar2 + d->_M_string_length);
  return;
}

Assistant:

Exception( const std::string& t, const std::string& d )
  : std::logic_error( d.size() ? t + ": " + d : t ),
    type( t ), detail( d )
  {}